

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcapimin.c
# Opt level: O1

void jpeg_write_m_header(j_compress_ptr cinfo,int marker,uint datalen)

{
  jpeg_error_mgr *pjVar1;
  
  if ((cinfo->next_scanline != 0) || (2 < cinfo->global_state - 0x65U)) {
    pjVar1 = cinfo->err;
    pjVar1->msg_code = 0x14;
    (pjVar1->msg_parm).i[0] = cinfo->global_state;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  (*cinfo->marker->write_marker_header)(cinfo,marker,datalen);
  return;
}

Assistant:

GLOBAL(void)
jpeg_write_m_header(j_compress_ptr cinfo, int marker, unsigned int datalen)
{
  if (cinfo->next_scanline != 0 ||
      (cinfo->global_state != CSTATE_SCANNING &&
       cinfo->global_state != CSTATE_RAW_OK &&
       cinfo->global_state != CSTATE_WRCOEFS))
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);

  (*cinfo->marker->write_marker_header) (cinfo, marker, datalen);
}